

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

void prvTidyAdjustTags(TidyDocImpl *doc)

{
  _DictHash *p_Var1;
  DictHash *pDVar2;
  Dict *np;
  Dict *pDVar3;
  uint i;
  long lVar4;
  
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_A) {
      pDVar3->parser = prvTidyParseInline;
      pDVar3->model = 0x10;
      break;
    }
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x99);
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_CAPTION) {
      pDVar3->parser = prvTidyParseInline;
      break;
    }
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x99);
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_OBJECT) {
      *(byte *)&pDVar3->model = (byte)pDVar3->model | 4;
      break;
    }
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x99);
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_BUTTON) {
      pDVar3->parser = prvTidyParseBlock;
      break;
    }
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x99);
  lVar4 = 0;
  do {
    pDVar2 = (doc->tags).hashtab[lVar4];
    while (pDVar2 != (DictHash *)0x0) {
      p_Var1 = pDVar2->next;
      (*doc->allocator->vtbl->free)(doc->allocator,pDVar2);
      pDVar2 = p_Var1;
    }
    (doc->tags).hashtab[lVar4] = (DictHash *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb2);
  doc->HTML5Mode = no;
  return;
}

Assistant:

void TY_(AdjustTags)( TidyDocImpl *doc )
{
    Dict *np = (Dict *)TY_(LookupTagDef)( TidyTag_A );
    TidyTagImpl* tags = &doc->tags;
    if (np) 
    {
        np->parser = TY_(ParseInline);
        np->model  = CM_INLINE;
    }

/*\
 * Issue #196
 * TidyTag_CAPTION allows %flow; in HTML5,
 * but only %inline; in HTML4
\*/
    np = (Dict *)TY_(LookupTagDef)( TidyTag_CAPTION );
    if (np)
    {
        np->parser = TY_(ParseInline);
    }

/*\
 * Issue #232
 * TidyTag_OBJECT not in head in HTML5,
 * but still allowed in HTML4
\*/
    np = (Dict *)TY_(LookupTagDef)( TidyTag_OBJECT );
    if (np)
    {
        np->model |= CM_HEAD; /* add back allowed in head */
    }

/*\
 * Issue #461
 * TidyTag_BUTTON is a block in HTML4,
 * whereas it is inline in HTML5
\*/
    np = (Dict *)TY_(LookupTagDef)(TidyTag_BUTTON);
    if (np)
    {
        np->parser = TY_(ParseBlock);
    }

    tagsEmptyHash(doc, tags); /* not sure this is really required, but to be sure */
    doc->HTML5Mode = no;   /* set *NOT* HTML5 mode */

}